

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdEmuD3D0Config::emulate_mthd(MthdEmuD3D0Config *this)

{
  uint uVar1;
  int iVar2;
  int local_38;
  int local_34;
  int i;
  int sblend;
  int dblend;
  int cull;
  int scull;
  int wrapv;
  int wrapu;
  int sinterp;
  int origin;
  int filt;
  MthdEmuD3D0Config *this_local;
  
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.misc32[3] =
       (this->super_SingleMthdTest).super_MthdTest.val;
  sinterp = 1;
  wrapu = 0;
  uVar1 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3c) >> 0x3c);
  if (uVar1 == 0) {
    wrapu = 2;
  }
  if (uVar1 == 2) {
    sinterp = 2;
  }
  scull = (int)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3a) >> 0x3e);
  if (scull == 0) {
    scull = 9;
  }
  cull = (int)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x38) >> 0x3e);
  if (cull == 0) {
    cull = 9;
  }
  uVar1 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x32) >> 0x3e);
  sblend = 0;
  if (uVar1 == 0) {
    sblend = 1;
  }
  else if (uVar1 == 1) {
    sblend = 1;
  }
  else if (uVar1 == 2) {
    sblend = 3;
  }
  else if (uVar1 == 3) {
    sblend = 2;
  }
  i = 6;
  local_34 = 5;
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x22) < 0) {
    i = 10;
    local_34 = 9;
  }
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x23) < 0) {
    local_34 = 2;
    i = 2;
  }
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x21) < 0) {
    i = 1;
  }
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) < 0) {
    local_34 = 1;
  }
  for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_format[local_38] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_format[local_38]
         & 0xffffffcf | wrapu << 4;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_format[local_38] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_format[local_38]
         & 0xf0ffffff | scull << 0x18;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_format[local_38] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_format[local_38]
         & 0xfffffff | cull << 0x1c;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_38] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_38]
         & 0xf8ffffff | sinterp << 0x18;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_38] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[local_38]
         & 0x8fffffff | sinterp << 0x1c;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend & 0xffffffcf |
       0x10;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend & 0xffffff3f |
       0x80;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend & 0xfffffeff |
       0x100;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend & 0xffffefff;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend & 0xfffeffff |
       0x10000;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend & 0xffefffff |
       0x100000;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend & 0xf0ffffff |
       local_34 << 0x18;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_blend & 0xfffffff |
       i << 0x1c;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config & 0xffffbfff |
       (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x29) >> 0x3d != 0) << 0xe;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config & 0xfff0ffff |
       (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2c) >> 0x3c) << 0x10);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config & 0xffcfffff |
       sblend << 0x14;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config & 0xffbfffff |
       0x400000;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config & 0xff7fffff |
       (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x30) >> 0x3f) << 0x17);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config & 0xfeffffff |
       (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x29) >> 0x3d != 0) << 0x18
  ;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config & 0xfdffffff;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config & 0xfbffffff;
  iVar2 = 0;
  if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x25) >> 0x3d != 0) {
    iVar2 = 7;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config & 0xc7ffffff |
       iVar2 << 0x1b;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_config & 0x3fffffff |
       0x40000000;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_stencil_func = 0x80;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_stencil_op = 0x222;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xfffdffff |
       0x20000;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xfeffffff |
       0x1000000;
  return;
}

Assistant:

void emulate_mthd() override {
		exp.misc32[3] = val;
		int filt = 1;
		int origin = 0;
		int sinterp = extr(val, 0, 4);
		if (sinterp == 0)
			origin = 2;
		if (sinterp == 2)
			filt = 2;
		int wrapu = extr(val, 4, 2);
		if (wrapu == 0)
			wrapu = 9;
		int wrapv = extr(val, 6, 2);
		if (wrapv == 0)
			wrapv = 9;
		int scull = extr(val, 12, 2);
		int cull = 0;
		if (scull == 0) {
			cull = 1;
		} else if (scull == 1) {
			cull = 1;
		} else if (scull == 2) {
			cull = 3;
		} else if (scull == 3) {
			cull = 2;
		}
		int dblend = 6;
		int sblend = 5;
		if (extr(val, 29, 1)) {
			dblend = 0xa;
			sblend = 0x9;
		}
		if (extr(val, 28, 1))
			dblend = sblend = 2;
		if (extr(val, 30, 1))
			dblend = 1;
		if (extr(val, 31, 1))
			sblend = 1;
		for (int i = 0; i < 2; i++) {
			insrt(exp.d3d56_tex_format[i], 4, 2, origin);
			insrt(exp.d3d56_tex_format[i], 24, 4, wrapu);
			insrt(exp.d3d56_tex_format[i], 28, 4, wrapv);
			insrt(exp.d3d56_tex_filter[i], 24, 3, filt);
			insrt(exp.d3d56_tex_filter[i], 28, 3, filt);
		}
		insrt(exp.d3d56_blend, 4, 2, 1);
		insrt(exp.d3d56_blend, 6, 2, 2);
		insrt(exp.d3d56_blend, 8, 1, 1);
		insrt(exp.d3d56_blend, 12, 1, 0);
		insrt(exp.d3d56_blend, 16, 1, 1);
		insrt(exp.d3d56_blend, 20, 1, 1);
		insrt(exp.d3d56_blend, 24, 4, sblend);
		insrt(exp.d3d56_blend, 28, 4, dblend);
		insrt(exp.d3d56_config, 14, 1, !!extr(val, 20, 3));
		insrt(exp.d3d56_config, 16, 4, extr(val, 16, 4));
		insrt(exp.d3d56_config, 20, 2, cull);
		insrt(exp.d3d56_config, 22, 1, 1);
		insrt(exp.d3d56_config, 23, 1, extr(val, 15, 1));
		insrt(exp.d3d56_config, 24, 1, !!extr(val, 20, 3));
		insrt(exp.d3d56_config, 25, 1, 0);
		insrt(exp.d3d56_config, 26, 1, 0);
		insrt(exp.d3d56_config, 27, 3, extr(val, 24, 3) ? 0x7 : 0);
		insrt(exp.d3d56_config, 30, 2, 1);
		exp.d3d56_stencil_func = 0x80;
		exp.d3d56_stencil_op = 0x222;
		insrt(exp.valid[1], 17, 1, 1);
		insrt(exp.valid[1], 24, 1, 1);
	}